

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModifiedPage.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PDFModifiedPage::WriteModifiedResourcesDict_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PDFModifiedPage *this,PDFParser *inParser,
          PDFDictionary *inResourcesDictionary,ObjectsContext *inObjectContext,
          PDFDocumentCopyingContext *inCopyingContext)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 auVar3 [8];
  iteratorType iVar4;
  int iVar5;
  ObjectsContext *pOVar6;
  string *psVar7;
  DictionaryContext *this_00;
  PDFObject *inOriginal;
  long *plVar8;
  size_type *psVar9;
  pointer ppPVar10;
  PDFModifiedPage *pPVar11;
  string imageObjectName;
  string name;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  itExisting;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  resourcesDictionaryIt;
  PDFObjectCastPtr<PDFDictionary> existingXObjectDict;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  ulong local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  DictionaryContext *local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  PDFModifiedPage *local_78;
  int local_6c;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  local_68;
  ObjectsContext *local_50;
  RefCountPtr<PDFDictionary> local_48;
  PDFParser *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = __return_storage_ptr__;
  PDFDictionary::GetIterator(&local_68,inResourcesDictionary);
  local_78 = this;
  local_38 = inParser;
  pOVar6 = PDFWriter::GetObjectsContext(this->mWriter);
  local_88 = ObjectsContext::StartDictionary(pOVar6);
  if (local_68.
      super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
      .mCurrentPosition._M_node !=
      local_68.
      super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
      .mEndPosition._M_node) {
    do {
      iVar4._M_node =
           local_68.
           super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
           .mEndPosition._M_node;
      if (local_68.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mFirstMove == true) {
        local_68.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mFirstMove = false;
      }
      else {
        local_68.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mCurrentPosition._M_node =
             (_Base_ptr)
             std::_Rb_tree_increment
                       (local_68.
                        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                        .mCurrentPosition._M_node);
        if (local_68.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mCurrentPosition._M_node == iVar4._M_node) break;
      }
      psVar7 = PDFName::GetValue_abi_cxx11_
                         (*(PDFName **)
                           (local_68.
                            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                            .mCurrentPosition._M_node + 1));
      iVar5 = std::__cxx11::string::compare((char *)psVar7);
      if (iVar5 != 0) {
        psVar7 = PDFName::GetValue_abi_cxx11_
                           (*(PDFName **)
                             (local_68.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mCurrentPosition._M_node + 1));
        DictionaryContext::WriteKey(local_88,psVar7);
        PDFDocumentCopyingContext::CopyDirectObjectAsIs
                  (inCopyingContext,
                   (PDFObject *)
                   local_68.
                   super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   .mCurrentPosition._M_node[1]._M_parent);
      }
    } while (local_68.
             super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             .mCurrentPosition._M_node !=
             local_68.
             super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             .mEndPosition._M_node);
  }
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"XObject","");
  DictionaryContext::WriteKey(local_88,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  this_00 = ObjectsContext::StartDictionary(inObjectContext);
  pPVar11 = local_78;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"XObject","");
  inOriginal = PDFParser::QueryDictionaryObject(local_38,inResourcesDictionary,&local_e8);
  local_48.mValue = PDFObjectCast<PDFDictionary>(inOriginal);
  local_48._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a58a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_50 = inObjectContext;
  if (local_48.mValue != (PDFDictionary *)0x0) {
    PDFDictionary::GetIterator
              ((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                *)local_a8,local_48.mValue);
    if ((undefined1  [8])local_98._M_allocated_capacity != local_a8) {
      do {
        auVar3 = local_a8;
        if (local_a0._0_1_ == true) {
          local_a0 = local_a0 & 0xffffffffffffff00;
        }
        else {
          local_98._M_allocated_capacity = std::_Rb_tree_increment(local_98._M_allocated_capacity);
          if ((undefined1  [8])local_98._M_allocated_capacity == auVar3) break;
        }
        psVar7 = PDFName::GetValue_abi_cxx11_
                           ((PDFName *)
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(local_98._M_allocated_capacity + 0x20))->_M_allocated_capacity);
        pcVar2 = (psVar7->_M_dataplus)._M_p;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar2,pcVar2 + psVar7->_M_string_length);
        DictionaryContext::WriteKey(this_00,&local_c8);
        PDFDocumentCopyingContext::CopyDirectObjectAsIs
                  (inCopyingContext,*(PDFObject **)(local_98._M_allocated_capacity + 0x28));
        std::__cxx11::string::push_back((char)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      } while ((undefined1  [8])local_98._M_allocated_capacity != local_a8);
    }
    ObjectsContext::EndLine(local_50);
    pPVar11 = local_78;
  }
  ppPVar10 = (pPVar11->mContenxts).
             super__Vector_base<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::__cxx11::string::push_back((char)&local_e8);
  if (ppPVar10 !=
      (pPVar11->mContenxts).super__Vector_base<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar5 = 0;
    do {
      local_6c = iVar5;
      BoxingBaseWithRW<int,STDStreamsReader<int>,STDStreamsWriter<int>>::ToString_abi_cxx11_
                ((string *)local_a8,&local_6c);
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_a8,0,(char *)0x0,(ulong)local_e8._M_dataplus._M_p);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_c8.field_2._M_allocated_capacity = *psVar9;
        local_c8.field_2._8_8_ = plVar8[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar9;
        local_c8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_c8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_a8 != (undefined1  [8])&local_98) {
        operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
      }
      DictionaryContext::WriteKey(this_00,&local_c8);
      local_a8 = (undefined1  [8])PDFFormXObject::GetObjectID(*ppPVar10);
      local_a0 = 0;
      DictionaryContext::WriteObjectReferenceValue(this_00,(ObjectReference *)local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_80,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      iVar5 = iVar5 + 1;
      ppPVar10 = ppPVar10 + 1;
    } while (ppPVar10 !=
             (local_78->mContenxts).
             super__Vector_base<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pOVar6 = local_50;
  ObjectsContext::EndDictionary(local_50,this_00);
  ObjectsContext::EndDictionary(pOVar6,local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_48);
  return local_80;
}

Assistant:

vector<string> PDFModifiedPage::WriteModifiedResourcesDict(PDFParser* inParser,PDFDictionary* inResourcesDictionary,ObjectsContext& inObjectContext,PDFDocumentCopyingContext* inCopyingContext)
{
	vector<string> formResourcesNames;

    MapIterator<PDFNameToPDFObjectMap>  resourcesDictionaryIt = inResourcesDictionary->GetIterator();
        
    // create modified page object
    DictionaryContext* dict = mWriter->GetObjectsContext().StartDictionary();
        
    // copy all elements of the page to the new page object, but the "Contents" and "Resources" elements
    while(resourcesDictionaryIt.MoveNext())
    {
        if(resourcesDictionaryIt.GetKey()->GetValue() != "XObject")
        {
            dict->WriteKey(resourcesDictionaryIt.GetKey()->GetValue());
            inCopyingContext->CopyDirectObjectAsIs(resourcesDictionaryIt.GetValue());
        }
    }   

    // now write a new xobject entry.
	dict->WriteKey("XObject");
	DictionaryContext* xobjectDict = inObjectContext.StartDictionary();

	PDFObjectCastPtr<PDFDictionary> existingXObjectDict(inParser->QueryDictionaryObject(inResourcesDictionary,"XObject"));
    string imageObjectName;
	if(existingXObjectDict.GetPtr())
	{
        // i'm having a very sophisticated algo here to create a new unique name. 
        // i'm making sure it's different in one letter from any name, using a well known discrete math proof method

		MapIterator<PDFNameToPDFObjectMap>  itExisting = existingXObjectDict->GetIterator();
		unsigned long i=0;
		while(itExisting.MoveNext())
		{
			string name = itExisting.GetKey()->GetValue();
			xobjectDict->WriteKey(name);
			inCopyingContext->CopyDirectObjectAsIs(itExisting.GetValue());
			imageObjectName.push_back((char)(GetDifferentChar((name.length() >= i+1) ? name[i]:0x39)));
			++i;
		}
		inObjectContext.EndLine();
	}

	PDFFormXObjectVector::iterator itForms = mContenxts.begin();
	imageObjectName.push_back('_');
	for(int i=0;itForms != mContenxts.end();++i,++itForms)
	{
		string formObjectName = imageObjectName + Int(i).ToString();
		xobjectDict->WriteKey(formObjectName);
		xobjectDict->WriteObjectReferenceValue((*itForms)->GetObjectID());
		formResourcesNames.push_back(formObjectName);
	}

	inObjectContext.EndDictionary(xobjectDict);
	inObjectContext.EndDictionary(dict);

	return formResourcesNames;
}